

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginElemSegment
          (BinaryReaderIR *this,Index index,Index table_index,bool passive)

{
  ElemSegmentModuleField *pEVar1;
  Location local_a8;
  Var local_88;
  ElemSegmentModuleField *local_40;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_38;
  
  GetLocation(&local_88.loc,this);
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location>((wabt *)&local_40,&local_88.loc);
  pEVar1 = local_40;
  GetLocation(&local_a8,this);
  Var::Var(&local_88,table_index,&local_a8);
  Var::operator=(&(pEVar1->elem_segment).table_var,&local_88);
  Var::~Var(&local_88);
  (pEVar1->elem_segment).passive = passive;
  local_38._M_head_impl = local_40;
  local_40 = (ElemSegmentModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (ElemSegmentModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (ElemSegmentModuleField *)0x0;
  if (local_40 != (ElemSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginElemSegment(Index index,
                                        Index table_index,
                                        bool passive) {
  auto field = MakeUnique<ElemSegmentModuleField>(GetLocation());
  ElemSegment& elem_segment = field->elem_segment;
  elem_segment.table_var = Var(table_index, GetLocation());
  elem_segment.passive = passive;
  module_->AppendField(std::move(field));
  return Result::Ok;
}